

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O1

bool __thiscall
ruckig::TargetCalculator<3UL,_ruckig::StandardVector>::synchronize
          (TargetCalculator<3UL,_ruckig::StandardVector> *this,optional<double> t_min,double *t_sync
          ,optional<unsigned_long> *limiting_dof,Vector<Profile> *profiles,bool discrete_duration,
          double delta_time)

{
  StandardVectorIntervals<size_t> *__first;
  long lVar1;
  double *pdVar2;
  char cVar3;
  size_t sVar4;
  unsigned_long uVar5;
  ulong uVar6;
  unsigned_long *puVar7;
  long lVar8;
  StandardVectorIntervals<size_t> *pSVar9;
  long lVar10;
  size_t sVar11;
  StandardVector<Block,_3UL> *__last;
  Block *__src;
  long lVar12;
  long lVar13;
  byte bVar14;
  bool bVar16;
  _Storage<double,_true> _Var17;
  double dVar18;
  undefined8 uVar19;
  ldiv_t lVar20;
  _Storage<double,_true> local_48;
  byte bVar15;
  
  local_48 = t_min.super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_payload;
  sVar4 = this->degrees_of_freedom;
  if (sVar4 == 0) {
    bVar14 = 0;
  }
  else {
    lVar8 = sVar4 * 0x10 + 0x30;
    lVar10 = sVar4 + 6;
    lVar12 = 0x57d;
    lVar13 = 0xc4;
    bVar14 = 0;
    do {
      if (*(int *)((long)(this->new_phase_control)._M_elems + lVar12 * 4) == 3) {
        *(undefined8 *)((long)this + lVar12 * 8 + -0x2bb8) = 0;
        (this->new_phase_control)._M_elems[lVar10] = INFINITY;
        *(undefined8 *)((long)(this->new_phase_control)._M_elems + lVar8) = 0x7ff0000000000000;
      }
      else {
        *(undefined8 *)((long)this + lVar12 * 8 + -0x2bb8) =
             *(undefined8 *)((long)(this->new_phase_control)._M_elems + lVar13 * 4);
        cVar3 = *(char *)((long)(this->blocks)._M_elems[0].p_min.brake.j._M_elems + lVar13 * 4 + 8);
        dVar18 = INFINITY;
        if (cVar3 == '\x01') {
          dVar18 = *(double *)((long)(this->pd)._M_elems + lVar13 * 4 + -8);
        }
        (this->new_phase_control)._M_elems[lVar10] = dVar18;
        bVar15 = *(byte *)((long)&(this->blocks)._M_elems[0].a.
                                  super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                  _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                                  _M_payload + lVar13 * 4 + 0x198);
        uVar19 = 0x7ff0000000000000;
        if (bVar15 == 1) {
          uVar19 = *(undefined8 *)
                    ((long)(this->blocks)._M_elems[0].p_min.brake.a._M_elems + lVar13 * 4 + 8);
        }
        *(undefined8 *)((long)(this->new_phase_control)._M_elems + lVar8) = uVar19;
        if (cVar3 != '\0') {
          bVar15 = 1;
        }
        bVar14 = bVar15 | bVar14;
      }
      lVar8 = lVar8 + 8;
      lVar10 = lVar10 + 1;
      lVar1 = lVar12 - sVar4;
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0x1be;
    } while (lVar1 != 0x57c);
  }
  _Var17 = local_48;
  if (((undefined1  [16])
       t_min.super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    _Var17._M_value = INFINITY;
  }
  ((_Storage<double,_true> *)((this->possible_t_syncs)._M_elems + sVar4 * 3))->_M_value =
       (double)_Var17;
  if (discrete_duration) {
    lVar10 = 0x30;
    do {
      dVar18 = *(double *)((long)(this->new_phase_control)._M_elems + lVar10);
      if ((ABS(dVar18) != INFINITY) &&
         (dVar18 = fmod(dVar18,delta_time), 2.220446049250313e-16 < dVar18)) {
        *(double *)((long)(this->new_phase_control)._M_elems + lVar10) =
             (delta_time - dVar18) + *(double *)((long)(this->new_phase_control)._M_elems + lVar10);
      }
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0x80);
  }
  __first = &this->idx;
  __last = (StandardVector<Block,_3UL> *)((this->idx)._M_elems + this->degrees_of_freedom);
  if (((bVar14 | t_min.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_engaged) & 1) != 0) {
    __last = &this->blocks;
  }
  if ((StandardVector<Block,_3UL> *)__first != __last) {
    uVar5 = 0;
    pSVar9 = __first;
    do {
      pSVar9->_M_elems[0] = uVar5;
      uVar5 = uVar5 + 1;
      pSVar9 = (StandardVectorIntervals<size_t> *)(pSVar9->_M_elems + 1);
    } while ((StandardVector<Block,_3UL> *)pSVar9 != __last);
    if ((StandardVector<Block,_3UL> *)__first != __last) {
      uVar6 = (long)__last - (long)__first >> 3;
      lVar10 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<ruckig::TargetCalculator<3ul,ruckig::StandardVector>::synchronize(std::optional<double>,double&,std::optional<unsigned_long>&,std::array<ruckig::Profile,3ul>&,bool,double)::_lambda(unsigned_long,unsigned_long)_1_>>
                (__first->_M_elems,(unsigned_long *)__last,(ulong)(((uint)lVar10 ^ 0x3f) * 2) ^ 0x7e
                 ,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pantor[P]ruckig_include_ruckig_calculator_target_hpp:161:41)>
                   )this);
      std::
      __final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<ruckig::TargetCalculator<3ul,ruckig::StandardVector>::synchronize(std::optional<double>,double&,std::optional<unsigned_long>&,std::array<ruckig::Profile,3ul>&,bool,double)::_lambda(unsigned_long,unsigned_long)_1_>>
                (__first->_M_elems,(unsigned_long *)__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pantor[P]ruckig_include_ruckig_calculator_target_hpp:161:41)>
                  )this);
    }
  }
  sVar4 = this->degrees_of_freedom;
  puVar7 = __first->_M_elems + (sVar4 - 1);
  bVar16 = (StandardVector<Block,_3UL> *)puVar7 != __last;
  if (bVar16) {
    if (((undefined1  [16])
         t_min.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_48._M_value = 0.0;
    }
    do {
      uVar5 = *puVar7;
      dVar18 = (this->possible_t_syncs)._M_elems[uVar5];
      if (sVar4 != 0) {
        lVar10 = 0xc4;
        sVar11 = 0;
        do {
          if (((this->inp_per_dof_synchronization)._M_elems[sVar11] != None) &&
             (((dVar18 < *(double *)((long)(this->new_phase_control)._M_elems + lVar10 * 4) ||
               (((*(char *)((long)(this->blocks)._M_elems[0].p_min.brake.j._M_elems + lVar10 * 4 + 8
                           ) == '\x01' &&
                 (pdVar2 = (double *)((long)(this->new_phase_control)._M_elems + lVar10 * 4 + 8),
                 *pdVar2 <= dVar18 && dVar18 != *pdVar2)) &&
                (dVar18 < *(double *)((long)(this->pd)._M_elems + lVar10 * 4 + -8))))) ||
              (((*(char *)((long)&(this->blocks)._M_elems[0].a.
                                  super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                  _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                                  _M_payload + lVar10 * 4 + 0x198) == '\x01' &&
                (pdVar2 = (double *)
                          ((long)(this->blocks)._M_elems[0].p_min.brake.a._M_elems + lVar10 * 4),
                *pdVar2 <= dVar18 && dVar18 != *pdVar2)) &&
               (dVar18 < *(double *)
                          ((long)(this->blocks)._M_elems[0].p_min.brake.a._M_elems + lVar10 * 4 + 8)
               )))))) goto LAB_00149c17;
          sVar11 = sVar11 + 1;
          lVar10 = lVar10 + 0x1be;
        } while (sVar4 != sVar11);
      }
      if (ABS(dVar18) != INFINITY && local_48._M_value <= dVar18) {
        *t_sync = dVar18;
        if (uVar5 == sVar4 * 3) {
          if ((limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged != true) {
            return bVar16;
          }
          (limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged = false;
          return bVar16;
        }
        lVar20 = ldiv(uVar5,sVar4);
        lVar10 = lVar20.quot;
        (limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value = lVar20.rem;
        if ((limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged == false) {
          (limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged = true;
        }
        if (lVar10 == 2) {
          if ((limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged == false) goto LAB_00149cfa;
          uVar5 = (limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_payload._M_value;
          __src = (Block *)((long)&(this->blocks)._M_elems[uVar5].b.
                                   super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                   _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                                   _M_payload + 0x10);
        }
        else if (lVar10 == 1) {
          if ((limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged == false) goto LAB_00149cfa;
          uVar5 = (limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_payload._M_value;
          __src = (Block *)((long)&(this->blocks)._M_elems[uVar5].a.
                                   super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                   _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                                   _M_payload + 0x10);
        }
        else {
          if (lVar10 != 0) {
            return bVar16;
          }
          if ((limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged == false) {
LAB_00149cfa:
            std::__throw_bad_optional_access();
          }
          uVar5 = (limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_payload._M_value;
          __src = (this->blocks)._M_elems + uVar5;
        }
        memcpy(profiles->_M_elems + uVar5,__src,0x23c);
        return bVar16;
      }
LAB_00149c17:
      puVar7 = puVar7 + 1;
      bVar16 = (StandardVector<Block,_3UL> *)puVar7 != __last;
    } while (bVar16);
  }
  return bVar16;
}

Assistant:

bool synchronize(std::optional<double> t_min, double& t_sync, std::optional<size_t>& limiting_dof, Vector<Profile>& profiles, bool discrete_duration, double delta_time) {
        // Check for (degrees_of_freedom == 1 && !t_min && !discrete_duration) is now outside

        // Possible t_syncs are the start times of the intervals and optional t_min
        bool any_interval {false};
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            // Ignore DoFs without synchronization here
            if (inp_per_dof_synchronization[dof] == Synchronization::None) {
                possible_t_syncs[dof] = 0.0;
                possible_t_syncs[degrees_of_freedom + dof] = std::numeric_limits<double>::infinity();
                possible_t_syncs[2 * degrees_of_freedom + dof] = std::numeric_limits<double>::infinity();
                continue;
            }

            possible_t_syncs[dof] = blocks[dof].t_min;
            possible_t_syncs[degrees_of_freedom + dof] = blocks[dof].a ? blocks[dof].a->right : std::numeric_limits<double>::infinity();
            possible_t_syncs[2 * degrees_of_freedom + dof] = blocks[dof].b ? blocks[dof].b->right : std::numeric_limits<double>::infinity();
            any_interval |= blocks[dof].a || blocks[dof].b;
        }
        possible_t_syncs[3 * degrees_of_freedom] = t_min.value_or(std::numeric_limits<double>::infinity());
        any_interval |= t_min.has_value();

        if (discrete_duration) {
            for (auto& possible_t_sync: possible_t_syncs) {
                if (std::isinf(possible_t_sync)) {
                    continue;
                }

                const double remainder = std::fmod(possible_t_sync, delta_time); // in [0, delta_time)
                if (remainder > eps) {
                    possible_t_sync += delta_time - remainder;
                }
            }
        }

        // Test them in sorted order
        auto idx_end = any_interval ? idx.end() : idx.begin() + degrees_of_freedom;
        std::iota(idx.begin(), idx_end, 0);
        std::sort(idx.begin(), idx_end, [&](size_t i, size_t j) { return possible_t_syncs[i] < possible_t_syncs[j]; });

        // Start at last tmin (or worse)
        for (auto i = idx.begin() + degrees_of_freedom - 1; i != idx_end; ++i) {
            const double possible_t_sync = possible_t_syncs[*i];
            bool is_blocked {false};
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp_per_dof_synchronization[dof] == Synchronization::None) {
                    continue; // inner dof loop
                }
                if (blocks[dof].is_blocked(possible_t_sync)) {
                    is_blocked = true;
                    break; // inner dof loop
                }
            }
            if (is_blocked || possible_t_sync < t_min.value_or(0.0) || std::isinf(possible_t_sync)) {
                continue;
            }

            t_sync = possible_t_sync;
            if (*i == 3*degrees_of_freedom) { // Optional t_min
                limiting_dof = std::nullopt;
                return true;
            }

            const auto div = std::div(static_cast<long>(*i), static_cast<long>(degrees_of_freedom));
            limiting_dof = div.rem;
            switch (div.quot) {
                case 0: {
                    profiles[limiting_dof.value()] = blocks[limiting_dof.value()].p_min;
                } break;
                case 1: {
                    profiles[limiting_dof.value()] = blocks[limiting_dof.value()].a->profile;
                } break;
                case 2: {
                    profiles[limiting_dof.value()] = blocks[limiting_dof.value()].b->profile;
                } break;
            }
            return true;
        }

        return false;
    }